

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O1

bool __thiscall
QOpenGLProgramBinaryCache::setProgramBinary
          (QOpenGLProgramBinaryCache *this,uint programId,uint blobFormat,void *p,uint blobSize)

{
  int iVar1;
  uint uVar2;
  QOpenGLContext *this_00;
  QOpenGLExtraFunctions *pQVar3;
  char *pcVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  GLint linkStatus;
  uint local_54;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QOpenGLContext::currentContext();
  pQVar3 = QOpenGLContext::extraFunctions(this_00);
  do {
    iVar1 = (*(((pQVar3->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x17])();
    if (iVar1 == 0x507) break;
  } while (iVar1 != 0);
  (*(pQVar3->super_QOpenGLFunctions).d_ptr[1].field_0.functions[0x61])
            ((ulong)programId,(ulong)blobFormat,p);
  uVar2 = (*(((pQVar3->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x17])();
  if (uVar2 == 0) {
    local_54 = 0;
    (*(((pQVar3->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x55])
              ((ulong)programId,0x8b82,&local_54);
    uVar2 = local_54;
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    bVar6 = uVar2 == 1;
    if (bVar6) {
      if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                 _q_value._M_base._M_i & 1) == 0) goto LAB_0056bba4;
      local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
      pcVar4 = "Program binary set for program %u, size %d, format 0x%x, err = 0x%x";
      uVar5 = 0;
    }
    else {
      if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                 _q_value._M_base._M_i & 1) == 0) goto LAB_0056bba4;
      local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
      uVar5 = (ulong)local_54;
      pcVar4 = 
      "Program binary failed to load for program %u, size %d, format 0x%x, linkStatus = 0x%x, err = 0x%x"
      ;
    }
  }
  else {
    uVar5 = (ulong)uVar2;
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
               _q_value._M_base._M_i & 1) == 0) {
      bVar6 = false;
      goto LAB_0056bba4;
    }
    local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
    pcVar4 = "Program binary failed to load for program %u, size %d, format 0x%x, err = 0x%x";
    bVar6 = false;
  }
  local_50[0x14] = '\0';
  local_50[0x15] = '\0';
  local_50[0x16] = '\0';
  local_50[0x17] = '\0';
  local_50[0xc] = '\0';
  local_50[0xd] = '\0';
  local_50[0xe] = '\0';
  local_50[0xf] = '\0';
  local_50[0x10] = '\0';
  local_50[0x11] = '\0';
  local_50[0x12] = '\0';
  local_50[0x13] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  local_50[8] = '\0';
  local_50[9] = '\0';
  local_50[10] = '\0';
  local_50[0xb] = '\0';
  local_50[0] = '\x02';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  QtPrivateLogging::lcOpenGLProgramDiskCache::category.name = local_38;
  QMessageLogger::debug(local_50,pcVar4,(ulong)programId,blobSize,(ulong)blobFormat,uVar5);
LAB_0056bba4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLProgramBinaryCache::setProgramBinary(uint programId, uint blobFormat, const void *p, uint blobSize)
{
    QOpenGLContext *context = QOpenGLContext::currentContext();
    QOpenGLExtraFunctions *funcs = context->extraFunctions();
    while (true) {
        GLenum error = funcs->glGetError();
        if (error == GL_NO_ERROR || error == GL_CONTEXT_LOST)
            break;
    }
#if QT_CONFIG(opengles2)
    if (context->isOpenGLES() && context->format().majorVersion() < 3) {
        initializeProgramBinaryOES(context);
        programBinaryOES(programId, blobFormat, p, blobSize);
    } else
#endif
    funcs->glProgramBinary(programId, blobFormat, p, blobSize);

    GLenum err = funcs->glGetError();
    if (err != GL_NO_ERROR) {
        qCDebug(lcOpenGLProgramDiskCache, "Program binary failed to load for program %u, size %d, "
                                  "format 0x%x, err = 0x%x",
                programId, blobSize, blobFormat, err);
        return false;
    }
    GLint linkStatus = 0;
    funcs->glGetProgramiv(programId, GL_LINK_STATUS, &linkStatus);
    if (linkStatus != GL_TRUE) {
        qCDebug(lcOpenGLProgramDiskCache, "Program binary failed to load for program %u, size %d, "
                                  "format 0x%x, linkStatus = 0x%x, err = 0x%x",
                programId, blobSize, blobFormat, linkStatus, err);
        return false;
    }

    qCDebug(lcOpenGLProgramDiskCache, "Program binary set for program %u, size %d, format 0x%x, err = 0x%x",
            programId, blobSize, blobFormat, err);
    return true;
}